

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall MuxerManager::asyncWriteBlock(MuxerManager *this,WriterData *data)

{
  int iVar1;
  WriterData *data_local;
  MuxerManager *this_local;
  
  while( true ) {
    iVar1 = BufferedFileWriter::getQueueSize(this->m_fileWriter);
    if (iVar1 < 0x81) break;
    Process::sleep(1);
  }
  BufferedFileWriter::addWriterData(this->m_fileWriter,data);
  return;
}

Assistant:

void MuxerManager::asyncWriteBlock(const WriterData& data) const
{
    static constexpr int nMaxWriteQueueSize = 256 * 1024 * 1024 / DEFAULT_FILE_BLOCK_SIZE;
    while (m_fileWriter->getQueueSize() > nMaxWriteQueueSize)
    {
        Process::sleep(1);
    }
    m_fileWriter->addWriterData(data);
}